

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  pointer piVar2;
  Nonnull<const_char_*> pcVar3;
  LogMessage *v1;
  string_view str;
  LogMessage LStack_28;
  
  v1 = &LStack_28;
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x226,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_28,str)
    ;
    goto LAB_001d4441;
  }
  if (pEVar1->is_repeated == false) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      SetRepeatedEnum((ExtensionSet *)&LStack_28);
LAB_001d4415:
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,8,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      v1 = (LogMessage *)
           (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (v1 != (LogMessage *)0x8) goto LAB_001d4415;
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      piVar2 = RepeatedField<int>::Mutable((RepeatedField<int> *)pEVar1->field_0,index);
      *piVar2 = value;
      return;
    }
  }
  else {
    SetRepeatedEnum();
  }
  SetRepeatedEnum();
LAB_001d4441:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->ptr.repeated_enum_value->Set(index, value);
}